

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop.c
# Opt level: O0

int uv_loop_fork(uv_loop_t *loop)

{
  uv__io_t *puVar1;
  int iVar2;
  uv__io_t *w;
  uint i;
  int err;
  uv_loop_t *loop_local;
  
  loop_local._4_4_ = uv__io_fork(loop);
  if (((loop_local._4_4_ == 0) && (loop_local._4_4_ = uv__async_fork(loop), loop_local._4_4_ == 0))
     && (loop_local._4_4_ = uv__signal_loop_fork(loop), loop_local._4_4_ == 0)) {
    for (w._0_4_ = 0; (uint)w < loop->nwatchers; w._0_4_ = (uint)w + 1) {
      puVar1 = loop->watchers[(uint)w];
      if (((puVar1 != (uv__io_t *)0x0) && (puVar1->pevents != 0)) &&
         (iVar2 = uv__queue_empty(&puVar1->watcher_queue), iVar2 != 0)) {
        puVar1->events = 0;
        uv__queue_insert_tail(&loop->watcher_queue,&puVar1->watcher_queue);
      }
    }
    loop_local._4_4_ = 0;
  }
  return loop_local._4_4_;
}

Assistant:

int uv_loop_fork(uv_loop_t* loop) {
  int err;
  unsigned int i;
  uv__io_t* w;

  err = uv__io_fork(loop);
  if (err)
    return err;

  err = uv__async_fork(loop);
  if (err)
    return err;

  err = uv__signal_loop_fork(loop);
  if (err)
    return err;

  /* Rearm all the watchers that aren't re-queued by the above. */
  for (i = 0; i < loop->nwatchers; i++) {
    w = loop->watchers[i];
    if (w == NULL)
      continue;

    if (w->pevents != 0 && uv__queue_empty(&w->watcher_queue)) {
      w->events = 0; /* Force re-registration in uv__io_poll. */
      uv__queue_insert_tail(&loop->watcher_queue, &w->watcher_queue);
    }
  }

  return 0;
}